

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libhoard.cpp
# Opt level: O2

void * xxmemalign(size_t alignment,size_t sz)

{
  ulong uVar1;
  void *pvVar2;
  
  uVar1 = alignment - 1;
  if (uVar1 < (alignment ^ uVar1)) {
    pvVar2 = xxmalloc(sz);
    if ((0x10 < alignment) && (((ulong)pvVar2 & uVar1) != 0)) {
      xxfree(pvVar2);
      pvVar2 = xxmalloc(sz + alignment * 2);
      pvVar2 = (void *)((long)pvVar2 + (alignment - 1) & -alignment);
    }
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

void * xxmemalign (size_t alignment, size_t sz) {
#else
  void * xxmemalign (size_t alignment, size_t sz) {
#endif
    return generic_xxmemalign(alignment, sz);
  }
    
  size_t xxmalloc_usable_size (void * ptr) {
    return getCustomHeap()->getSize (ptr);
  }

  void xxmalloc_lock() {
    // Undefined for Hoard.
  }

  void xxmalloc_unlock() {
    // Undefined for Hoard.
  }

}